

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.h
# Opt level: O0

cmListFileContext *
cmListFileContext::FromCommandContext
          (cmListFileContext *__return_storage_ptr__,cmCommandContext *lfcc,string *fileName)

{
  string *fileName_local;
  cmCommandContext *lfcc_local;
  cmListFileContext *lfc;
  
  cmListFileContext(__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->FilePath,(string *)fileName);
  __return_storage_ptr__->Line = lfcc->Line;
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&(lfcc->Name).Original)
  ;
  return __return_storage_ptr__;
}

Assistant:

static cmListFileContext FromCommandContext(cmCommandContext const& lfcc,
                                              std::string const& fileName)
  {
    cmListFileContext lfc;
    lfc.FilePath = fileName;
    lfc.Line = lfcc.Line;
    lfc.Name = lfcc.Name.Original;
    return lfc;
  }